

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O1

wchar_t lzx_make_huffman_table(huffman *hf)

{
  wchar_t wVar1;
  int iVar2;
  uchar *puVar3;
  uint16_t *puVar4;
  wchar_t wVar5;
  byte bVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  wchar_t wVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  int aiStack_a8 [10];
  wchar_t bitptn [17];
  
  wVar5 = L'耀';
  uVar7 = 0;
  uVar11 = 0;
  iVar8 = 0;
  do {
    aiStack_a8[uVar7 + 1] = iVar8;
    bitptn[uVar7 + 0xb] = wVar5;
    lVar12 = uVar7 + 1;
    iVar8 = hf->freq[lVar12] * wVar5 + iVar8;
    uVar7 = uVar7 + 1;
    if (hf->freq[lVar12] != L'\0') {
      uVar11 = uVar7 & 0xffffffff;
    }
    wVar5 = (uint)wVar5 >> 1;
  } while (uVar7 != 0x10);
  wVar5 = L'\0';
  if ((short)iVar8 == 0) {
    wVar1 = hf->tbl_bits;
    wVar10 = (wchar_t)uVar11;
    if (wVar10 <= wVar1) {
      hf->max_bits = wVar10;
      if ((wVar10 < L'\x10') && (L'\0' < wVar10)) {
        bVar6 = 0x10 - (char)uVar11;
        uVar7 = 1;
        do {
          aiStack_a8[uVar7] = aiStack_a8[uVar7] >> (bVar6 & 0x1f);
          bitptn[uVar7 + 10] = bitptn[uVar7 + 10] >> (bVar6 & 0x1f);
          uVar7 = uVar7 + 1;
        } while ((uint)(wVar10 + L'\x01') != uVar7);
      }
      wVar5 = L'\x01';
      iVar8 = 1 << ((byte)wVar1 & 0x1f);
      puVar3 = hf->bitlen;
      puVar4 = hf->tbl;
      wVar1 = hf->len_size;
      hf->tree_used = L'\0';
      if (0 < (long)wVar1) {
        lVar12 = 0;
        do {
          bVar6 = puVar3[lVar12];
          if (bVar6 == 0) {
            iVar13 = 10;
          }
          else {
            iVar13 = 1;
            if ((int)(uint)bVar6 <= iVar8) {
              iVar2 = aiStack_a8[bVar6];
              wVar10 = bitptn[(ulong)bVar6 + 10];
              iVar9 = wVar10 + iVar2;
              aiStack_a8[bVar6] = iVar9;
              if ((iVar9 <= iVar8) && (iVar13 = 0, L'\0' < wVar10)) {
                lVar14 = (ulong)(uint)wVar10 + 1;
                do {
                  puVar4[(long)iVar2 + lVar14 + -2] = (uint16_t)lVar12;
                  lVar14 = lVar14 + -1;
                } while (1 < lVar14);
              }
            }
          }
          if ((iVar13 != 10) && (iVar13 != 0)) {
            return L'\0';
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != wVar1);
      }
    }
  }
  return wVar5;
}

Assistant:

static int
lzx_make_huffman_table(struct huffman *hf)
{
	uint16_t *tbl;
	const unsigned char *bitlen;
	int bitptn[17], weight[17];
	int i, maxbits = 0, ptn, tbl_size, w;
	int len_avail;

	/*
	 * Initialize bit patterns.
	 */
	ptn = 0;
	for (i = 1, w = 1 << 15; i <= 16; i++, w >>= 1) {
		bitptn[i] = ptn;
		weight[i] = w;
		if (hf->freq[i]) {
			ptn += hf->freq[i] * w;
			maxbits = i;
		}
	}
	if ((ptn & 0xffff) != 0 || maxbits > hf->tbl_bits)
		return (0);/* Invalid */

	hf->max_bits = maxbits;

	/*
	 * Cut out extra bits which we won't house in the table.
	 * This preparation reduces the same calculation in the for-loop
	 * making the table.
	 */
	if (maxbits < 16) {
		int ebits = 16 - maxbits;
		for (i = 1; i <= maxbits; i++) {
			bitptn[i] >>= ebits;
			weight[i] >>= ebits;
		}
	}

	/*
	 * Make the table.
	 */
	tbl_size = 1 << hf->tbl_bits;
	tbl = hf->tbl;
	bitlen = hf->bitlen;
	len_avail = hf->len_size;
	hf->tree_used = 0;
	for (i = 0; i < len_avail; i++) {
		uint16_t *p;
		int len, cnt;

		if (bitlen[i] == 0)
			continue;
		/* Get a bit pattern */
		len = bitlen[i];
		if (len > tbl_size)
			return (0);
		ptn = bitptn[len];
		cnt = weight[len];
		/* Calculate next bit pattern */
		if ((bitptn[len] = ptn + cnt) > tbl_size)
			return (0);/* Invalid */
		/* Update the table */
		p = &(tbl[ptn]);
		while (--cnt >= 0)
			p[cnt] = (uint16_t)i;
	}
	return (1);
}